

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

void handle_static_file_request
               (mg_connection *conn,char *path,mg_file *filep,char *mime_type,
               char *additional_headers)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  long local_11f0;
  size_t local_11e8;
  int local_11cc;
  char local_11c8 [4];
  int trunc;
  char len [32];
  mg_file_stat file_stat;
  char *pcStack_1180;
  int is_head_request;
  char *encoding;
  char gz_path [4096];
  int local_170;
  int local_16c;
  int truncated;
  int n;
  vec mime_vec;
  int64_t r2;
  int64_t r1;
  int64_t cl;
  char *range_hdr;
  char range [128];
  char etag [64];
  char lm [64];
  char *additional_headers_local;
  char *mime_type_local;
  mg_file *filep_local;
  char *path_local;
  mg_connection *conn_local;
  
  pcStack_1180 = (char *)0x0;
  if (((conn != (mg_connection *)0x0) && (conn->dom_ctx != (mg_domain_context *)0x0)) &&
     (filep != (mg_file *)0x0)) {
    iVar1 = strcmp((conn->request_info).request_method,"HEAD");
    if (mime_type == (char *)0x0) {
      get_mime_type(conn,path,(vec *)&truncated);
    }
    else {
      _truncated = mime_type;
      mime_vec.ptr = (char *)strlen(mime_type);
    }
    if ((filep->stat).size < 0x8000000000000000) {
      r1 = (filep->stat).size;
      conn->status_code = 200;
      range_hdr._0_1_ = '\0';
      cl = (int64_t)mg_get_header(conn,"Range");
      if ((filep->stat).is_gzipped == 0) {
        filep_local = (mg_file *)path;
        if ((((conn->accept_gzip != 0) && ((char *)cl == (char *)0x0)) &&
            ((0x3ff < (filep->stat).size &&
             ((mg_snprintf(conn,&local_170,(char *)&encoding,0x1000,"%s.gz",path), local_170 == 0 &&
              (iVar2 = mg_stat(conn,(char *)&encoding,(mg_file_stat *)(len + 0x18)), iVar2 != 0)))))
            ) && ((int)file_stat.last_modified == 0)) {
          (filep->stat).size = len._24_8_;
          (filep->stat).last_modified = file_stat.size;
          (filep->stat).is_directory = 0;
          (filep->stat).is_gzipped = 1;
          (filep->stat).location = file_stat.is_directory;
          *(int *)&(filep->stat).field_0x1c = file_stat.is_gzipped;
          r1 = (filep->stat).size;
          filep_local = (mg_file *)&encoding;
          pcStack_1180 = "gzip";
        }
      }
      else {
        mg_snprintf(conn,&local_170,(char *)&encoding,0x1000,"%s.gz",path);
        if (local_170 != 0) {
          mg_send_http_error(conn,500,"Error: Path of zipped file too long (%s)",path);
          return;
        }
        filep_local = (mg_file *)&encoding;
        pcStack_1180 = "gzip";
      }
      iVar2 = mg_fopen(conn,(char *)filep_local,1,filep);
      if (iVar2 == 0) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        mg_send_http_error(conn,500,"Error: Cannot open file\nfopen(%s): %s",filep_local,pcVar4);
      }
      else {
        fclose_on_exec(&filep->access,conn);
        mime_vec.len = 0;
        r2 = 0;
        if ((((cl != 0) &&
             (local_16c = parse_range_header((char *)cl,&r2,(int64_t *)&mime_vec.len), 0 < local_16c
             )) && (-1 < r2)) && (-1 < (long)mime_vec.len)) {
          if ((filep->stat).is_gzipped != 0) {
            mg_send_http_error(conn,0x1a0,"%s",
                               "Error: Range requests in gzipped files are not supported");
            mg_fclose(&filep->access);
            return;
          }
          conn->status_code = 0xce;
          if (local_16c == 2) {
            if (r1 < (long)mime_vec.len) {
              local_11e8 = r1;
            }
            else {
              local_11e8 = mime_vec.len;
            }
            local_11f0 = (local_11e8 - r2) + 1;
          }
          else {
            local_11f0 = r1 - r2;
          }
          r1 = local_11f0;
          mg_snprintf(conn,(int *)0x0,(char *)&range_hdr,0x80,"bytes %ld-%ld/%ld",r2,
                      r2 + local_11f0 + -1,(filep->stat).size);
        }
        gmt_time_string(etag + 0x38,0x40,&(filep->stat).last_modified);
        construct_etag(range + 0x78,0x40,&filep->stat);
        mg_response_header_start(conn,conn->status_code);
        send_static_cache_header(conn);
        send_additional_header(conn);
        send_cors_header(conn);
        mg_response_header_add(conn,"Content-Type",_truncated,(int)mime_vec.ptr);
        mg_response_header_add(conn,"Last-Modified",etag + 0x38,-1);
        mg_response_header_add(conn,"Etag",range + 0x78,-1);
        local_11cc = 0;
        mg_snprintf(conn,&local_11cc,local_11c8,0x20,"%ld",r1);
        if (local_11cc == 0) {
          mg_response_header_add(conn,"Content-Length",local_11c8,-1);
        }
        mg_response_header_add(conn,"Accept-Ranges","bytes",-1);
        if (pcStack_1180 != (char *)0x0) {
          mg_response_header_add(conn,"Content-Encoding",pcStack_1180,-1);
        }
        if ((char)range_hdr != '\0') {
          mg_response_header_add(conn,"Content-Range",(char *)&range_hdr,-1);
        }
        if ((additional_headers != (char *)0x0) && (*additional_headers != '\0')) {
          mg_response_header_add_lines(conn,additional_headers);
        }
        mg_response_header_send(conn);
        if (iVar1 != 0) {
          send_file_data(conn,filep,r2,r1,0);
        }
        mg_fclose(&filep->access);
      }
    }
    else {
      mg_send_http_error(conn,500,"Error: File size is too large to send\n%ld",(filep->stat).size);
    }
  }
  return;
}

Assistant:

static void
handle_static_file_request(struct mg_connection *conn,
                           const char *path,
                           struct mg_file *filep,
                           const char *mime_type,
                           const char *additional_headers)
{
	char lm[64], etag[64];
	char range[128]; /* large enough, so there will be no overflow */
	const char *range_hdr;
	int64_t cl, r1, r2;
	struct vec mime_vec;
	int n, truncated;
	char gz_path[UTF8_PATH_MAX];
	const char *encoding = 0;
	int is_head_request;

#if defined(USE_ZLIB)
	/* Compression is allowed, unless there is a reason not to use
	 * compression. If the file is already compressed, too small or a
	 * "range" request was made, on the fly compression is not possible. */
	int allow_on_the_fly_compression = 1;
#endif

	if ((conn == NULL) || (conn->dom_ctx == NULL) || (filep == NULL)) {
		return;
	}

	is_head_request = !strcmp(conn->request_info.request_method, "HEAD");

	if (mime_type == NULL) {
		get_mime_type(conn, path, &mime_vec);
	} else {
		mime_vec.ptr = mime_type;
		mime_vec.len = strlen(mime_type);
	}
	if (filep->stat.size > INT64_MAX) {
		mg_send_http_error(conn,
		                   500,
		                   "Error: File size is too large to send\n%" INT64_FMT,
		                   filep->stat.size);
		return;
	}
	cl = (int64_t)filep->stat.size;
	conn->status_code = 200;
	range[0] = '\0';

#if defined(USE_ZLIB)
	/* if this file is in fact a pre-gzipped file, rewrite its filename
	 * it's important to rewrite the filename after resolving
	 * the mime type from it, to preserve the actual file's type */
	if (!conn->accept_gzip) {
		allow_on_the_fly_compression = 0;
	}
#endif

	/* Check if there is a range header */
	range_hdr = mg_get_header(conn, "Range");

	/* For gzipped files, add *.gz */
	if (filep->stat.is_gzipped) {
		mg_snprintf(conn, &truncated, gz_path, sizeof(gz_path), "%s.gz", path);

		if (truncated) {
			mg_send_http_error(conn,
			                   500,
			                   "Error: Path of zipped file too long (%s)",
			                   path);
			return;
		}

		path = gz_path;
		encoding = "gzip";

#if defined(USE_ZLIB)
		/* File is already compressed. No "on the fly" compression. */
		allow_on_the_fly_compression = 0;
#endif
	} else if ((conn->accept_gzip) && (range_hdr == NULL)
	           && (filep->stat.size >= MG_FILE_COMPRESSION_SIZE_LIMIT)) {
		struct mg_file_stat file_stat;

		mg_snprintf(conn, &truncated, gz_path, sizeof(gz_path), "%s.gz", path);

		if (!truncated && mg_stat(conn, gz_path, &file_stat)
		    && !file_stat.is_directory) {
			file_stat.is_gzipped = 1;
			filep->stat = file_stat;
			cl = (int64_t)filep->stat.size;
			path = gz_path;
			encoding = "gzip";

#if defined(USE_ZLIB)
			/* File is already compressed. No "on the fly" compression. */
			allow_on_the_fly_compression = 0;
#endif
		}
	}

	if (!mg_fopen(conn, path, MG_FOPEN_MODE_READ, filep)) {
		mg_send_http_error(conn,
		                   500,
		                   "Error: Cannot open file\nfopen(%s): %s",
		                   path,
		                   strerror(ERRNO));
		return;
	}

	fclose_on_exec(&filep->access, conn);

	/* If "Range" request was made: parse header, send only selected part
	 * of the file. */
	r1 = r2 = 0;
	if ((range_hdr != NULL)
	    && ((n = parse_range_header(range_hdr, &r1, &r2)) > 0) && (r1 >= 0)
	    && (r2 >= 0)) {
		/* actually, range requests don't play well with a pre-gzipped
		 * file (since the range is specified in the uncompressed space) */
		if (filep->stat.is_gzipped) {
			mg_send_http_error(
			    conn,
			    416, /* 416 = Range Not Satisfiable */
			    "%s",
			    "Error: Range requests in gzipped files are not supported");
			(void)mg_fclose(
			    &filep->access); /* ignore error on read only file */
			return;
		}
		conn->status_code = 206;
		cl = (n == 2) ? (((r2 > cl) ? cl : r2) - r1 + 1) : (cl - r1);
		mg_snprintf(conn,
		            NULL, /* range buffer is big enough */
		            range,
		            sizeof(range),
		            "bytes "
		            "%" INT64_FMT "-%" INT64_FMT "/%" INT64_FMT,
		            r1,
		            r1 + cl - 1,
		            filep->stat.size);

#if defined(USE_ZLIB)
		/* Do not compress ranges. */
		allow_on_the_fly_compression = 0;
#endif
	}

	/* Do not compress small files. Small files do not benefit from file
	 * compression, but there is still some overhead. */
#if defined(USE_ZLIB)
	if (filep->stat.size < MG_FILE_COMPRESSION_SIZE_LIMIT) {
		/* File is below the size limit. */
		allow_on_the_fly_compression = 0;
	}
#endif

	/* Prepare Etag, and Last-Modified headers. */
	gmt_time_string(lm, sizeof(lm), &filep->stat.last_modified);
	construct_etag(etag, sizeof(etag), &filep->stat);

	/* Create 2xx (200, 206) response */
	mg_response_header_start(conn, conn->status_code);
	send_static_cache_header(conn);
	send_additional_header(conn);
	send_cors_header(conn);
	mg_response_header_add(conn,
	                       "Content-Type",
	                       mime_vec.ptr,
	                       (int)mime_vec.len);
	mg_response_header_add(conn, "Last-Modified", lm, -1);
	mg_response_header_add(conn, "Etag", etag, -1);

#if defined(USE_ZLIB)
	/* On the fly compression allowed */
	if (allow_on_the_fly_compression) {
		/* For on the fly compression, we don't know the content size in
		 * advance, so we have to use chunked encoding */
		encoding = "gzip";
		if (conn->protocol_type == PROTOCOL_TYPE_HTTP1) {
			/* HTTP/2 is always using "chunks" (frames) */
			mg_response_header_add(conn, "Transfer-Encoding", "chunked", -1);
		}

	} else
#endif
	{
		/* Without on-the-fly compression, we know the content-length
		 * and we can use ranges (with on-the-fly compression we cannot).
		 * So we send these response headers only in this case. */
		char len[32];
		int trunc = 0;
		mg_snprintf(conn, &trunc, len, sizeof(len), "%" INT64_FMT, cl);

		if (!trunc) {
			mg_response_header_add(conn, "Content-Length", len, -1);
		}

		mg_response_header_add(conn, "Accept-Ranges", "bytes", -1);
	}

	if (encoding) {
		mg_response_header_add(conn, "Content-Encoding", encoding, -1);
	}
	if (range[0] != 0) {
		mg_response_header_add(conn, "Content-Range", range, -1);
	}

	/* The code above does not add any header starting with X- to make
	 * sure no one of the additional_headers is included twice */
	if ((additional_headers != NULL) && (*additional_headers != 0)) {
		mg_response_header_add_lines(conn, additional_headers);
	}

	/* Send all headers */
	mg_response_header_send(conn);

	if (!is_head_request) {
#if defined(USE_ZLIB)
		if (allow_on_the_fly_compression) {
			/* Compress and send */
			send_compressed_data(conn, filep);
		} else
#endif
		{
			/* Send file directly */
			send_file_data(conn, filep, r1, cl, 0); /* send static file */
		}
	}
	(void)mg_fclose(&filep->access); /* ignore error on read only file */
}